

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O1

void rr::resolveMultisampleDepthBuffer
               (PixelBufferAccess *dst,MultisampleConstPixelBufferAccess *src)

{
  int iVar1;
  int z;
  int x;
  int y;
  float fVar2;
  float fVar3;
  ConstPixelBufferAccess effectiveSrc;
  PixelBufferAccess effectiveDst;
  ConstPixelBufferAccess local_d0;
  PixelBufferAccess local_a8;
  MultisampleConstPixelBufferAccess local_80;
  ConstPixelBufferAccess local_58;
  
  tcu::getEffectiveDepthStencilAccess(&local_d0,&src->m_access,MODE_DEPTH);
  tcu::getEffectiveDepthStencilAccess(&local_a8,dst,MODE_DEPTH);
  iVar1 = (src->m_access).m_size.m_data[0];
  if (iVar1 == 1) {
    local_80.m_access.m_format = local_d0.m_format;
    local_80.m_access.m_size.m_data[0] = local_d0.m_size.m_data[0];
    local_80.m_access.m_size.m_data[1] = local_d0.m_size.m_data[1];
    local_80.m_access.m_size.m_data[2] = local_d0.m_size.m_data[2];
    local_80.m_access.m_pitch.m_data[0] = local_d0.m_pitch.m_data[0];
    local_80.m_access.m_pitch.m_data[1] = local_d0.m_pitch.m_data[1];
    local_80.m_access.m_pitch.m_data[2] = local_d0.m_pitch.m_data[2];
    local_80.m_access.m_data = local_d0.m_data;
    MultisampleConstPixelBufferAccess::toSinglesampleAccess(&local_58,&local_80);
    tcu::copy((EVP_PKEY_CTX *)&local_a8,(EVP_PKEY_CTX *)&local_58);
  }
  else if (0 < (dst->super_ConstPixelBufferAccess).m_size.m_data[1]) {
    z = 0;
    do {
      if (0 < (dst->super_ConstPixelBufferAccess).m_size.m_data[0]) {
        y = 0;
        do {
          if ((src->m_access).m_size.m_data[0] < 1) {
            fVar2 = 0.0;
          }
          else {
            fVar2 = 0.0;
            x = 0;
            do {
              fVar3 = tcu::ConstPixelBufferAccess::getPixDepth(&local_d0,x,y,z);
              fVar2 = fVar2 + fVar3;
              x = x + 1;
            } while (x < (src->m_access).m_size.m_data[0]);
          }
          tcu::PixelBufferAccess::setPixDepth(&local_a8,fVar2 * (1.0 / (float)iVar1),y,z,0);
          y = y + 1;
        } while (y < (dst->super_ConstPixelBufferAccess).m_size.m_data[0]);
      }
      z = z + 1;
    } while (z < (dst->super_ConstPixelBufferAccess).m_size.m_data[1]);
  }
  return;
}

Assistant:

void resolveMultisampleDepthBuffer (const tcu::PixelBufferAccess& dst, const MultisampleConstPixelBufferAccess& src)
{
	DE_ASSERT(dst.getWidth() == src.raw().getHeight());
	DE_ASSERT(dst.getHeight() == src.raw().getDepth());

	const tcu::ConstPixelBufferAccess	effectiveSrc = tcu::getEffectiveDepthStencilAccess(src.raw(), tcu::Sampler::MODE_DEPTH);
	const tcu::PixelBufferAccess		effectiveDst = tcu::getEffectiveDepthStencilAccess(dst, tcu::Sampler::MODE_DEPTH);

	if (src.getNumSamples() == 1)
	{
		// fast-path for non-multisampled cases
		tcu::copy(effectiveDst, MultisampleConstPixelBufferAccess::fromMultisampleAccess(effectiveSrc).toSinglesampleAccess());
	}
	else
	{
		const float numSamplesInv = 1.0f / (float)src.getNumSamples();

		for (int y = 0; y < dst.getHeight(); y++)
		for (int x = 0; x < dst.getWidth(); x++)
		{
			float sum = 0.0f;
			for (int s = 0; s < src.getNumSamples(); s++)
				sum += effectiveSrc.getPixDepth(s, x, y);

			effectiveDst.setPixDepth(sum*numSamplesInv, x, y);
		}
	}
}